

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slab_cache.c
# Opt level: O0

slab * slab_get(slab_cache *cache,size_t size)

{
  byte order_00;
  size_t sVar1;
  size_t sVar2;
  slab *psStack_20;
  uint8_t order;
  slab *slab;
  size_t size_local;
  slab_cache *cache_local;
  
  sVar1 = slab_sizeof();
  order_00 = slab_order(cache,size + sVar1);
  if ((uint)order_00 == cache->order_max + 1) {
    psStack_20 = slab_get_large(cache,size);
  }
  else {
    psStack_20 = slab_get_with_order(cache,order_00);
  }
  if (psStack_20 != (slab *)0x0) {
    sVar1 = psStack_20->size;
    sVar2 = slab_real_size(cache,size);
    if (sVar1 != sVar2) {
      __assert_fail("slab == NULL || slab->size == slab_real_size(cache, size)",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/small/slab_cache.c"
                    ,0x145,"struct slab *slab_get(struct slab_cache *, size_t)");
    }
  }
  return psStack_20;
}

Assistant:

struct slab *
slab_get(struct slab_cache *cache, size_t size)
{
	struct slab *slab;
	uint8_t order = slab_order(cache, size + slab_sizeof());
	if (order == cache->order_max + 1)
		slab = slab_get_large(cache, size);
	else
		slab = slab_get_with_order(cache, order);
	assert(slab == NULL || slab->size == slab_real_size(cache, size));
	return slab;
}